

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase105::run(TestCase105 *this)

{
  StructDataBitCount *this_00;
  bool bVar1;
  uint uVar2;
  Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *value;
  ArrayPtr<const_char> AVar3;
  Reader local_9b8;
  Reader local_988;
  Reader local_958;
  ArrayPtr<const_char> local_928;
  bool local_911;
  undefined1 local_910 [7];
  bool _kj_shouldLog_10;
  Reader local_8e0;
  Reader local_8b0;
  ArrayPtr<const_char> local_880;
  Reader local_870;
  Reader local_840;
  Reader local_810;
  ArrayPtr<const_char> local_7e0;
  bool local_7c9;
  undefined1 local_7c8 [7];
  bool _kj_shouldLog_9;
  Reader local_798;
  Reader local_768;
  ArrayPtr<const_char> local_738;
  Reader local_728;
  Reader local_6f8;
  uint local_6c8;
  uint local_6c4;
  Fault local_6c0;
  Fault f_2;
  Reader local_688;
  bool local_653;
  bool local_652;
  bool local_651;
  undefined1 local_650 [5];
  bool _kj_shouldLog_8;
  bool _kj_shouldLog_7;
  bool _kj_shouldLog_6;
  Builder local_628;
  Builder local_600;
  bool local_5e1;
  undefined1 local_5e0 [7];
  bool _kj_shouldLog_5;
  Builder local_5b8;
  Builder local_590;
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> local_578;
  Builder local_550;
  Builder local_528;
  bool local_509;
  undefined1 local_508 [7];
  bool _kj_shouldLog_4;
  Builder local_4e0;
  Builder local_4b8;
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> local_4a0;
  uint local_478;
  uint local_474;
  Fault local_470;
  Fault f_1;
  ReaderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> local_440;
  Reader local_410;
  ArrayPtr<const_char> local_3e0;
  bool local_3c9;
  undefined1 local_3c8 [7];
  bool _kj_shouldLog_3;
  Reader local_398;
  ArrayPtr<const_char> local_368;
  ReaderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> local_358;
  Reader local_328;
  ArrayPtr<const_char> local_2f8;
  bool local_2e1;
  undefined1 local_2e0 [7];
  bool _kj_shouldLog_2;
  Reader local_2b0;
  ArrayPtr<const_char> local_280;
  ReaderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> local_270;
  uint local_240;
  uint local_23c;
  Fault local_238;
  Fault f;
  bool local_1f9;
  undefined1 local_1f8 [7];
  bool _kj_shouldLog_1;
  Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> orphan;
  undefined1 auStack_1d0 [7];
  bool _kj_shouldLog;
  Builder local_1c0;
  ArrayPtr<const_char> local_198;
  Builder local_188;
  undefined1 local_160 [8];
  Builder list;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase105 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructList
            ((Builder *)local_160,(Builder *)local_128,2);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            (&local_188,(Builder *)local_160,0);
  Text::Reader::Reader((Reader *)&local_198,"foo");
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField(&local_188,(Reader)local_198);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            (&local_1c0,(Builder *)local_160,1);
  Text::Reader::Reader((Reader *)auStack_1d0,"bar");
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField(&local_1c0,(Reader)_auStack_1d0);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructList((Builder *)local_128);
  if (!bVar1) {
    orphan.builder.location._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)orphan.builder.location._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x70,ERROR,"\"failed: expected \" \"root.hasStructList()\"",
                 (char (*) [38])"failed: expected root.hasStructList()");
      orphan.builder.location._7_1_ = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::disownStructList
            ((Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             local_1f8,(Builder *)local_128);
  bVar1 = Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::
          operator==((Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>
                      *)local_1f8,(void *)0x0);
  if (bVar1) {
    local_1f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1f9 != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x73,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\"",
                 (char (*) [38])"failed: expected !(orphan == nullptr)");
      local_1f9 = false;
    }
  }
  Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::getReader
            ((ReaderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             &f,(Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
                local_1f8);
  uVar2 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                    ((Reader *)&f);
  if (uVar2 != 2) {
    local_23c = 2;
    Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::getReader
              (&local_270,
               (Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
               local_1f8);
    local_240 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                          (&local_270);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_238,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x75,FAILED,"(2u) == (orphan.getReader().size())","2u, orphan.getReader().size()",
               &local_23c,&local_240);
    kj::_::Debug::Fault::fatal(&local_238);
  }
  Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::getReader
            ((ReaderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             local_2e0,
             (Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             local_1f8);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
            (&local_2b0,(Reader *)local_2e0,0);
  local_280 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestAllTypes::Reader::getTextField(&local_2b0);
  bVar1 = kj::operator==("foo",(StringPtr *)&local_280);
  if (!bVar1) {
    local_2e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2e1 != false) {
      Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::getReader
                (&local_358,
                 (Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
                 local_1f8);
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
                (&local_328,&local_358,0);
      AVar3 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestAllTypes::Reader::getTextField(&local_328);
      local_2f8 = AVar3;
      kj::_::Debug::log<char_const(&)[67],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x76,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (orphan.getReader()[0].getTextField())\", \"foo\", orphan.getReader()[0].getTextField()"
                 ,(char (*) [67])
                  "failed: expected (\"foo\") == (orphan.getReader()[0].getTextField())",
                 (char (*) [4])"foo",(Reader *)&local_2f8);
      local_2e1 = false;
    }
  }
  Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::getReader
            ((ReaderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             local_3c8,
             (Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             local_1f8);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
            (&local_398,(Reader *)local_3c8,1);
  local_368 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestAllTypes::Reader::getTextField(&local_398);
  bVar1 = kj::operator==("bar",(StringPtr *)&local_368);
  if (!bVar1) {
    local_3c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_3c9 != false) {
      Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::getReader
                (&local_440,
                 (Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
                 local_1f8);
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
                (&local_410,&local_440,1);
      AVar3 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestAllTypes::Reader::getTextField(&local_410);
      local_3e0 = AVar3;
      kj::_::Debug::log<char_const(&)[67],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x77,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (orphan.getReader()[1].getTextField())\", \"bar\", orphan.getReader()[1].getTextField()"
                 ,(char (*) [67])
                  "failed: expected (\"bar\") == (orphan.getReader()[1].getTextField())",
                 (char (*) [4])0x4b5bf5,(Reader *)&local_3e0);
      local_3c9 = false;
    }
  }
  Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::get
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             &f_1,(Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *
                  )local_1f8);
  uVar2 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                    ((Builder *)&f_1);
  if (uVar2 != 2) {
    local_474 = 2;
    Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::get
              (&local_4a0,
               (Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
               local_1f8);
    local_478 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                          (&local_4a0);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_470,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x78,FAILED,"(2u) == (orphan.get().size())","2u, orphan.get().size()",&local_474,
               &local_478);
    kj::_::Debug::Fault::fatal(&local_470);
  }
  Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::get
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             local_508,
             (Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             local_1f8);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            (&local_4e0,(Builder *)local_508,0);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_4b8,&local_4e0);
  bVar1 = capnp::operator==("foo",&local_4b8);
  if (!bVar1) {
    local_509 = kj::_::Debug::shouldLog(ERROR);
    while (local_509 != false) {
      Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::get
                (&local_578,
                 (Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
                 local_1f8);
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
                (&local_550,&local_578,0);
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_528,&local_550);
      kj::_::Debug::log<char_const(&)[61],char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x79,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (orphan.get()[0].getTextField())\", \"foo\", orphan.get()[0].getTextField()"
                 ,(char (*) [61])"failed: expected (\"foo\") == (orphan.get()[0].getTextField())",
                 (char (*) [4])"foo",&local_528);
      local_509 = false;
    }
  }
  Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::get
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             local_5e0,
             (Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             local_1f8);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            (&local_5b8,(Builder *)local_5e0,1);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_590,&local_5b8);
  bVar1 = capnp::operator==("bar",&local_590);
  if (!bVar1) {
    local_5e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_5e1 != false) {
      Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::get
                ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>
                  *)local_650,
                 (Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
                 local_1f8);
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
                (&local_628,(Builder *)local_650,1);
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_600,&local_628);
      kj::_::Debug::log<char_const(&)[61],char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x7a,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (orphan.get()[1].getTextField())\", \"bar\", orphan.get()[1].getTextField()"
                 ,(char (*) [61])"failed: expected (\"bar\") == (orphan.get()[1].getTextField())",
                 (char (*) [4])0x4b5bf5,&local_600);
      local_5e1 = false;
    }
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructList((Builder *)local_128);
  if (bVar1) {
    local_651 = kj::_::Debug::shouldLog(ERROR);
    while (local_651 != false) {
      kj::_::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x7b,ERROR,"\"failed: expected \" \"!(root.hasStructList())\"",
                 (char (*) [41])"failed: expected !(root.hasStructList())");
      local_651 = false;
    }
  }
  value = kj::
          mv<capnp::Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>>
                    ((Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>
                      *)local_1f8);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptStructList((Builder *)local_128,value);
  bVar1 = Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::
          operator==((Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>
                      *)local_1f8,(void *)0x0);
  if (!bVar1) {
    local_652 = kj::_::Debug::shouldLog(ERROR);
    while (local_652 != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x7e,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
                 (char (*) [35])"failed: expected orphan == nullptr");
      local_652 = false;
    }
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructList((Builder *)local_128);
  if (!bVar1) {
    local_653 = kj::_::Debug::shouldLog(ERROR);
    while (local_653 != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x7f,ERROR,"\"failed: expected \" \"root.hasStructList()\"",
                 (char (*) [38])"failed: expected root.hasStructList()");
      local_653 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader((Reader *)&f_2,(Builder *)local_128);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructList(&local_688,(Reader *)&f_2);
  uVar2 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size(&local_688);
  if (uVar2 != 2) {
    local_6c4 = 2;
    capnproto_test::capnp::test::TestAllTypes::Builder::asReader(&local_728,(Builder *)local_128);
    capnproto_test::capnp::test::TestAllTypes::Reader::getStructList(&local_6f8,&local_728);
    local_6c8 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                          (&local_6f8);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_6c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x80,FAILED,"(2u) == (root.asReader().getStructList().size())",
               "2u, root.asReader().getStructList().size()",&local_6c4,&local_6c8);
    kj::_::Debug::Fault::fatal(&local_6c0);
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)local_7c8,(Builder *)local_128);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructList(&local_798,(Reader *)local_7c8);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
            (&local_768,&local_798,0);
  local_738 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestAllTypes::Reader::getTextField(&local_768);
  bVar1 = kj::operator==("foo",(StringPtr *)&local_738);
  if (!bVar1) {
    local_7c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_7c9 != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::asReader(&local_870,(Builder *)local_128);
      capnproto_test::capnp::test::TestAllTypes::Reader::getStructList(&local_840,&local_870);
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
                (&local_810,&local_840,0);
      AVar3 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestAllTypes::Reader::getTextField(&local_810);
      local_7e0 = AVar3;
      kj::_::Debug::log<char_const(&)[80],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x81,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (root.asReader().getStructList()[0].getTextField())\", \"foo\", root.asReader().getStructList()[0].getTextField()"
                 ,(char (*) [80])
                  "failed: expected (\"foo\") == (root.asReader().getStructList()[0].getTextField())"
                 ,(char (*) [4])"foo",(Reader *)&local_7e0);
      local_7c9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)local_910,(Builder *)local_128);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructList(&local_8e0,(Reader *)local_910);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
            (&local_8b0,&local_8e0,1);
  local_880 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestAllTypes::Reader::getTextField(&local_8b0);
  bVar1 = kj::operator==("bar",(StringPtr *)&local_880);
  if (!bVar1) {
    local_911 = kj::_::Debug::shouldLog(ERROR);
    while (local_911 != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::asReader(&local_9b8,(Builder *)local_128);
      capnproto_test::capnp::test::TestAllTypes::Reader::getStructList(&local_988,&local_9b8);
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
                (&local_958,&local_988,1);
      AVar3 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestAllTypes::Reader::getTextField(&local_958);
      local_928 = AVar3;
      kj::_::Debug::log<char_const(&)[80],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x82,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (root.asReader().getStructList()[1].getTextField())\", \"bar\", root.asReader().getStructList()[1].getTextField()"
                 ,(char (*) [80])
                  "failed: expected (\"bar\") == (root.asReader().getStructList()[1].getTextField())"
                 ,(char (*) [4])0x4b5bf5,(Reader *)&local_928);
      local_911 = false;
    }
  }
  Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_>::~Orphan
            ((Orphan<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             local_1f8);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Orphans, StructLists) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  auto list = root.initStructList(2);
  list[0].setTextField("foo");
  list[1].setTextField("bar");
  EXPECT_TRUE(root.hasStructList());

  Orphan<List<TestAllTypes>> orphan = root.disownStructList();
  EXPECT_FALSE(orphan == nullptr);

  ASSERT_EQ(2u, orphan.getReader().size());
  EXPECT_EQ("foo", orphan.getReader()[0].getTextField());
  EXPECT_EQ("bar", orphan.getReader()[1].getTextField());
  ASSERT_EQ(2u, orphan.get().size());
  EXPECT_EQ("foo", orphan.get()[0].getTextField());
  EXPECT_EQ("bar", orphan.get()[1].getTextField());
  EXPECT_FALSE(root.hasStructList());

  root.adoptStructList(kj::mv(orphan));
  EXPECT_TRUE(orphan == nullptr);
  EXPECT_TRUE(root.hasStructList());
  ASSERT_EQ(2u, root.asReader().getStructList().size());
  EXPECT_EQ("foo", root.asReader().getStructList()[0].getTextField());
  EXPECT_EQ("bar", root.asReader().getStructList()[1].getTextField());
}